

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O0

int h264_coeff_token(bitstream *str,h264_slice *slice,int cat,int idx,uint32_t *trailingOnes,
                    uint32_t *totalCoeff)

{
  int iVar1;
  uint local_88;
  uint32_t local_84;
  uint32_t tmp;
  int nC;
  int nB;
  int nA;
  int availB;
  int availA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  h264_macroblock *phStack_58;
  int inter;
  h264_macroblock *mbT;
  int idxB;
  int idxA;
  int which;
  h264_block_size bs;
  vs_vlc_val *tab;
  uint32_t *totalCoeff_local;
  uint32_t *trailingOnes_local;
  int idx_local;
  int cat_local;
  h264_slice *slice_local;
  bitstream *str_local;
  
  _which = (vs_vlc_val *)0x0;
  tab = (vs_vlc_val *)totalCoeff;
  totalCoeff_local = trailingOnes;
  trailingOnes_local._0_4_ = idx;
  trailingOnes_local._4_4_ = cat;
  _idx_local = slice;
  slice_local = (h264_slice *)str;
  switch(cat) {
  case 0:
  case 1:
  case 2:
  case 5:
    idxB = 0;
    idxA = 0;
    break;
  case 3:
    if (slice->chroma_array_type == 1) {
      _which = coeff_token_m1;
    }
    else {
      _which = coeff_token_m2;
    }
    break;
  case 4:
    idxB = (idx >> 3) + 1;
    trailingOnes_local._0_4_ = idx & 7;
    idxA = 1;
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    idxB = 1;
    idxA = 0;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    idxB = 2;
    idxA = 0;
    break;
  default:
    abort();
  }
  if (_which == (vs_vlc_val *)0x0) {
    phStack_58 = h264_mb_nb_p(slice,H264_MB_THIS,0);
    mbA._4_4_ = h264_is_inter_mb_type(phStack_58->mb_type);
    mbB = h264_mb_nb_b(_idx_local,H264_MB_A,idxA,mbA._4_4_,(uint)trailingOnes_local,
                       (int *)((long)&mbT + 4));
    _availB = h264_mb_nb_b(_idx_local,H264_MB_B,idxA,mbA._4_4_,(uint)trailingOnes_local,(int *)&mbT)
    ;
    mbB = h264_inter_filter(_idx_local,mbB,mbA._4_4_);
    _availB = h264_inter_filter(_idx_local,_availB,mbA._4_4_);
    nA = (int)(mbB->mb_type != 0x39);
    nB = (int)(_availB->mb_type != 0x39);
    nC = mbB->total_coeff[idxB][mbT._4_4_];
    tmp = _availB->total_coeff[idxB][(int)mbT];
    if ((nA == 0) || (nB == 0)) {
      local_84 = nC;
      if ((nA == 0) && (local_84 = tmp, nB == 0)) {
        local_84 = 0;
      }
    }
    else {
      local_84 = (int)(nC + tmp + 1) >> 1;
    }
    _which = coeff_token_tab[(int)local_84];
  }
  local_88 = *totalCoeff_local << 8 | tab->val;
  iVar1 = vs_vlc((bitstream *)slice_local,&local_88,_which);
  if (iVar1 == 0) {
    if (slice_local->nal_ref_idc == 1) {
      *totalCoeff_local = local_88 >> 8;
      tab->val = local_88 & 0xff;
    }
    str_local._4_4_ = 0;
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h264_coeff_token(struct bitstream *str, struct h264_slice *slice, int cat, int idx, uint32_t *trailingOnes, uint32_t *totalCoeff) {
	const struct vs_vlc_val *tab = 0;
	enum h264_block_size bs;
	int which;
	switch (cat) {
		case H264_CTXBLOCKCAT_CHROMA_DC:
			if (slice->chroma_array_type == 1)
				tab = coeff_token_m1;
			else
				tab = coeff_token_m2;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			which = (idx >> 3) + 1;
			idx &= 7;
			bs = H264_BLOCK_CHROMA;
			break;
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_LUMA_8X8:
			which = 0;
			bs = H264_BLOCK_4X4;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CB_8X8:
			which = 1;
			bs = H264_BLOCK_4X4;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CR_8X8:
			which = 2;
			bs = H264_BLOCK_4X4;
			break;
		default:
			abort();
	}
	if (!tab) {
		int idxA, idxB;
		const struct h264_macroblock *mbT = h264_mb_nb_p(slice, H264_MB_THIS, 0);
		int inter = h264_is_inter_mb_type(mbT->mb_type);
		const struct h264_macroblock *mbA = h264_mb_nb_b(slice, H264_MB_A, bs, inter, idx, &idxA);
		const struct h264_macroblock *mbB = h264_mb_nb_b(slice, H264_MB_B, bs, inter, idx, &idxB);
		mbA = h264_inter_filter(slice, mbA, inter);
		mbB = h264_inter_filter(slice, mbB, inter);
		int availA = mbA->mb_type != H264_MB_TYPE_UNAVAIL;
		int availB = mbB->mb_type != H264_MB_TYPE_UNAVAIL;
		int nA = mbA->total_coeff[which][idxA];
		int nB = mbB->total_coeff[which][idxB];
		int nC;
		if (availA && availB)
			nC = (nA + nB + 1) >> 1;
		else if (availA)
			nC = nA;
		else if (availB)
			nC = nB;
		else
			nC = 0;
		tab = coeff_token_tab[nC];
	}
	uint32_t tmp;
	tmp = *trailingOnes << 8 | *totalCoeff;
	if (vs_vlc(str, &tmp, tab)) return 1;
	if (str->dir == VS_DECODE) {
		*trailingOnes = tmp >> 8;
		*totalCoeff = tmp & 0xff;
	}
	return 0;
}